

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::PointerBuilder::getListAnySize
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,word *defaultValue)

{
  word *defaultValue_local;
  PointerBuilder *this_local;
  
  WireHelpers::getWritableListPointerAnySize
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,defaultValue);
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::getListAnySize(const word* defaultValue) {
  return WireHelpers::getWritableListPointerAnySize(pointer, segment, capTable, defaultValue);
}